

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O2

double S2::GetCurvature(S2PointLoopSpan loop)

{
  int iVar1;
  LoopOrder LVar2;
  reference pVVar3;
  reference pVVar4;
  reference pVVar5;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  S2PointLoopSpan loop_00;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  double local_78;
  S2PointSpan local_68;
  double local_58;
  double local_50;
  _Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> local_48;
  
  loop_00.super_S2PointSpan.ptr_ = (pointer)loop.super_S2PointSpan.len_;
  if (loop_00.super_S2PointSpan.ptr_ == (pointer)0x0) {
    local_78 = -6.283185307179586;
  }
  else {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    loop_00.super_S2PointSpan.len_ = (size_type)&local_48;
    local_68 = loop.super_S2PointSpan;
    local_68 = (S2PointSpan)PruneDegeneracies((S2 *)loop.super_S2PointSpan.ptr_,loop_00,in_RCX);
    if (local_68.len_ == 0) {
      local_78 = 6.283185307179586;
    }
    else {
      LVar2 = GetCanonicalLoopOrder((S2PointLoopSpan)local_68);
      iVar7 = (int)local_68.len_;
      iVar1 = LVar2.first;
      iVar6 = LVar2.dir;
      pVVar3 = S2PointLoopSpan::operator[]
                         ((S2PointLoopSpan *)&local_68,
                          ((iVar1 - iVar6) + (int)local_68.len_) % (int)local_68.len_);
      pVVar4 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_68,iVar1);
      pVVar5 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_68,(iVar1 + iVar6) % iVar7);
      dVar8 = TurnAngle(pVVar3,pVVar4,pVVar5);
      dVar9 = 0.0;
      for (; 1 < iVar7; iVar7 = iVar7 + -1) {
        iVar1 = LVar2.first;
        local_58 = dVar9;
        local_50 = dVar8;
        pVVar3 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_68,iVar1);
        pVVar4 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_68,iVar6 + iVar1);
        pVVar5 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_68,iVar1 + iVar6 * 2);
        dVar9 = TurnAngle(pVVar3,pVVar4,pVVar5);
        dVar8 = local_50 + local_58 + dVar9;
        dVar9 = local_58 + dVar9 + (local_50 - dVar8);
        LVar2.dir = 0;
        LVar2.first = iVar6 + iVar1;
      }
      local_78 = (double)iVar6 * (dVar8 + dVar9);
      if (6.283185307179585 <= local_78) {
        local_78 = 6.283185307179585;
      }
      if (local_78 <= -6.283185307179585) {
        local_78 = -6.283185307179585;
      }
    }
    std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base(&local_48);
  }
  return local_78;
}

Assistant:

double GetCurvature(S2PointLoopSpan loop) {
  // By convention, a loop with no vertices contains all points on the sphere.
  if (loop.empty()) return -2 * M_PI;

  // Remove any degeneracies from the loop.
  vector<S2Point> vertices;
  loop = PruneDegeneracies(loop, &vertices);

  // If the entire loop was degenerate, it's turning angle is defined as 2*Pi.
  if (loop.empty()) return 2 * M_PI;

  // To ensure that we get the same result when the vertex order is rotated,
  // and that the result is negated when the vertex order is reversed, we need
  // to add up the individual turn angles in a consistent order.  (In general,
  // adding up a set of numbers in a different order can change the sum due to
  // rounding errors.)
  //
  // Furthermore, if we just accumulate an ordinary sum then the worst-case
  // error is quadratic in the number of vertices.  (This can happen with
  // spiral shapes, where the partial sum of the turning angles can be linear
  // in the number of vertices.)  To avoid this we use the Kahan summation
  // algorithm (http://en.wikipedia.org/wiki/Kahan_summation_algorithm).
  LoopOrder order = GetCanonicalLoopOrder(loop);
  int i = order.first, dir = order.dir, n = loop.size();
  double sum = S2::TurnAngle(loop[(i + n - dir) % n], loop[i],
                             loop[(i + dir) % n]);
  double compensation = 0;  // Kahan summation algorithm
  while (--n > 0) {
    i += dir;
    double angle = S2::TurnAngle(loop[i - dir], loop[i], loop[i + dir]);
    double old_sum = sum;
    angle += compensation;
    sum += angle;
    compensation = (old_sum - sum) + angle;
  }
  constexpr double kMaxCurvature = 2 * M_PI - 4 * DBL_EPSILON;
  sum += compensation;
  return max(-kMaxCurvature, min(kMaxCurvature, dir * sum));
}